

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_HcFindBestMatch_selectMLS
                 (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iLimit,
                 size_t *offsetPtr)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *in_RCX;
  BYTE *in_RDX;
  BYTE *in_RSI;
  BYTE *in_RDI;
  ulong *in_R8;
  BYTE *match_5;
  BYTE *match_4;
  size_t currentMl_2;
  U32 matchIndex_2;
  size_t ml_2;
  U32 nbAttempts_2;
  U32 minChain_2;
  U32 current_2;
  U32 lowLimit_2;
  BYTE *dictEnd_2;
  BYTE *prefixStart_2;
  U32 dictLimit_2;
  BYTE *dictBase_2;
  BYTE *base_2;
  U32 chainMask_2;
  U32 chainSize_2;
  U32 *chainTable_2;
  BYTE *match_3;
  BYTE *match_2;
  size_t currentMl_1;
  U32 matchIndex_1;
  size_t ml_1;
  U32 nbAttempts_1;
  U32 minChain_1;
  U32 current_1;
  U32 lowLimit_1;
  BYTE *dictEnd_1;
  BYTE *prefixStart_1;
  U32 dictLimit_1;
  BYTE *dictBase_1;
  BYTE *base_1;
  U32 chainMask_1;
  U32 chainSize_1;
  U32 *chainTable_1;
  BYTE *match_1;
  BYTE *match;
  size_t currentMl;
  U32 matchIndex;
  size_t ml;
  U32 nbAttempts;
  U32 minChain;
  U32 current;
  U32 lowLimit;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  U32 chainMask;
  U32 chainSize;
  U32 *chainTable;
  uint local_228;
  uint local_220;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 mls;
  ZSTD_compressionParameters *in_stack_fffffffffffffe18;
  ZSTD_matchState_t *in_stack_fffffffffffffe20;
  ulong local_1d0;
  uint local_1c4;
  ulong local_1c0;
  int local_1b8;
  ulong local_130;
  uint local_124;
  ulong local_120;
  int local_118;
  ulong local_90;
  uint local_84;
  ulong local_80;
  int local_78;
  
  iVar1 = *(int *)(in_RSI + 0x10);
  iVar5 = (int)in_RDX;
  mls = (U32)((ulong)in_RSI >> 0x20);
  if (iVar1 != 4) {
    if (iVar1 == 5) {
      lVar3 = *(long *)(in_RDI + 0x40);
      uVar6 = 1 << ((byte)*(undefined4 *)(in_RSI + 4) & 0x1f);
      lVar4 = *(long *)(in_RDI + 8);
      uVar2 = *(uint *)(in_RDI + 0x1c);
      uVar7 = iVar5 - (int)lVar4;
      if (uVar6 < uVar7) {
        local_220 = uVar7 - uVar6;
      }
      else {
        local_220 = 0;
      }
      local_118 = 1 << ((byte)*(undefined4 *)(in_RSI + 0xc) & 0x1f);
      local_120 = 3;
      pBVar9 = in_RCX;
      pBVar10 = in_RDX;
      local_124 = ZSTD_insertAndFindFirstIndex_internal
                            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_RDI,mls);
      while( true ) {
        if (local_124 <= uVar2 || local_118 == 0) {
          return local_120;
        }
        local_130 = 0;
        if (*(BYTE *)(lVar4 + (ulong)local_124 + local_120) == in_RDX[local_120]) {
          local_130 = ZSTD_count(in_RSI,pBVar10,pBVar9);
        }
        if (local_120 < local_130) {
          local_120 = local_130;
          *in_R8 = (ulong)((uVar7 - local_124) + 2);
          if (in_RDX + local_130 == in_RCX) {
            return local_130;
          }
        }
        if (local_124 <= local_220) break;
        local_124 = *(uint *)(lVar3 + (ulong)(local_124 & uVar6 - 1) * 4);
        local_118 = local_118 + -1;
      }
      return local_120;
    }
    if (iVar1 - 6U < 2) {
      lVar3 = *(long *)(in_RDI + 0x40);
      uVar6 = 1 << ((byte)*(undefined4 *)(in_RSI + 4) & 0x1f);
      lVar4 = *(long *)(in_RDI + 8);
      uVar2 = *(uint *)(in_RDI + 0x1c);
      uVar7 = iVar5 - (int)lVar4;
      if (uVar6 < uVar7) {
        local_228 = uVar7 - uVar6;
      }
      else {
        local_228 = 0;
      }
      local_1b8 = 1 << ((byte)*(undefined4 *)(in_RSI + 0xc) & 0x1f);
      local_1c0 = 3;
      pBVar9 = in_RCX;
      pBVar10 = in_RDX;
      local_1c4 = ZSTD_insertAndFindFirstIndex_internal
                            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_RDI,mls);
      while( true ) {
        if (local_1c4 <= uVar2 || local_1b8 == 0) {
          return local_1c0;
        }
        local_1d0 = 0;
        if (*(BYTE *)(lVar4 + (ulong)local_1c4 + local_1c0) == in_RDX[local_1c0]) {
          local_1d0 = ZSTD_count(in_RSI,pBVar10,pBVar9);
        }
        if (local_1c0 < local_1d0) {
          local_1c0 = local_1d0;
          *in_R8 = (ulong)((uVar7 - local_1c4) + 2);
          if (in_RDX + local_1d0 == in_RCX) {
            return local_1d0;
          }
        }
        if (local_1c4 <= local_228) break;
        local_1c4 = *(uint *)(lVar3 + (ulong)(local_1c4 & uVar6 - 1) * 4);
        local_1b8 = local_1b8 + -1;
      }
      return local_1c0;
    }
  }
  lVar3 = *(long *)(in_RDI + 0x40);
  uVar6 = 1 << ((byte)*(undefined4 *)(in_RSI + 4) & 0x1f);
  lVar4 = *(long *)(in_RDI + 8);
  uVar2 = *(uint *)(in_RDI + 0x1c);
  uVar7 = iVar5 - (int)lVar4;
  if (uVar6 < uVar7) {
    uVar8 = uVar7 - uVar6;
  }
  else {
    uVar8 = 0;
  }
  local_78 = 1 << ((byte)*(undefined4 *)(in_RSI + 0xc) & 0x1f);
  local_80 = 3;
  pBVar9 = in_RCX;
  pBVar10 = in_RDX;
  local_84 = ZSTD_insertAndFindFirstIndex_internal
                       (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_RDI,mls);
  while( true ) {
    if (local_84 <= uVar2 || local_78 == 0) {
      return local_80;
    }
    local_90 = 0;
    if (*(BYTE *)(lVar4 + (ulong)local_84 + local_80) == in_RDX[local_80]) {
      local_90 = ZSTD_count(in_RSI,pBVar10,pBVar9);
    }
    if (local_80 < local_90) {
      local_80 = local_90;
      *in_R8 = (ulong)((uVar7 - local_84) + 2);
      if (in_RDX + local_90 == in_RCX) {
        return local_90;
      }
    }
    if (local_84 <= uVar8) break;
    local_84 = *(uint *)(lVar3 + (ulong)(local_84 & uVar6 - 1) * 4);
    local_78 = local_78 + -1;
  }
  return local_80;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t ZSTD_HcFindBestMatch_selectMLS (
                        ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(cParams->searchLength)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, cParams, ip, iLimit, offsetPtr, 4, 0);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, cParams, ip, iLimit, offsetPtr, 5, 0);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, cParams, ip, iLimit, offsetPtr, 6, 0);
    }
}